

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::DynamicProxy<IMessageHolder>::stubMethod<5,unsigned_long>
          (DynamicProxy<IMessageHolder> *this,offset_in_IMessageHolder_to_subr vMethod,
          MethodInvocationHandler<unsigned_long> *methodInvocationHandler)

{
  sockaddr *__addr;
  uint uVar1;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  ulong local_20;
  code *local_18;
  
  __addr = (sockaddr *)CONCAT44(in_register_0000000c,in_ECX);
  uVar1 = VTUtils::getOffset<IMessageHolder,unsigned_long>
                    ((VTUtils *)vMethod,(offset_in_IMessageHolder_to_subr)methodInvocationHandler);
  local_20 = (ulong)uVar1 << 0x20 | 6;
  local_18 = MethodProxyCreator<unsigned_long>::methodProxyX<6>;
  bind(this,(int)&local_20,__addr,in_ECX);
  return;
}

Assistant:

void stubMethod(R(C::*vMethod)(arglist...), MethodInvocationHandler<R, arglist...> *methodInvocationHandler) {
            auto offset = VTUtils::getOffset(vMethod);
            MethodProxyCreator<R, arglist...> creator;
            bind(creator.template createMethodProxy<id + 1>(offset), methodInvocationHandler);
        }